

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClauseCodeTree.cpp
# Opt level: O1

int __thiscall Indexing::ClauseCodeTree::remove(ClauseCodeTree *this,char *__filename)

{
  CodeOp ***pppCVar1;
  Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
  **ppRVar2;
  undefined8 *puVar3;
  CodeBlock *pCVar4;
  Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
  *pRVar5;
  LitInfo *pLVar6;
  Self SVar7;
  Self SVar8;
  bool bVar9;
  int iVar10;
  int extraout_EAX;
  ulong uVar11;
  uint litIndex;
  int iVar12;
  int iVar13;
  ulong s;
  long lVar14;
  CodeOp *pCVar15;
  uint uVar16;
  _Head_base<0UL,_Indexing::ClauseCodeTree::RemovingLiteralMatcher_*,_false> this_00;
  Recycled<Lib::Stack<Indexing::CodeTree::CodeOp_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  firstsInBlocks;
  Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
  rrlm;
  Recycled<Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  rlms;
  Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
  res;
  Recycled<Lib::Stack<Indexing::CodeTree::CodeOp_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  local_90;
  ulong local_80;
  LitInfo local_78;
  Recycled<Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  local_60;
  Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
  local_50;
  Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
  local_40;
  
  if (remove(Kernel::Clause*)::lInfos == '\0') {
    remove((char *)this);
  }
  ::Lib::
  Recycled<Lib::Stack<Indexing::CodeTree::CodeOp_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
  Recycled(&local_90);
  ::Lib::
  Recycled<Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::Recycled(&local_60);
  uVar11 = *(ulong *)(__filename + 0x38);
  uVar16 = (uint)uVar11;
  s = (ulong)(uVar16 & 0xfffff);
  ::Lib::DArray<Indexing::CodeTree::LitInfo>::ensure(&remove::lInfos,s);
  SVar7._M_t.
  super___uniq_ptr_impl<Lib::Stack<Indexing::CodeTree::CodeOp_*>,_std::default_delete<Lib::Stack<Indexing::CodeTree::CodeOp_*>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_Lib::Stack<Indexing::CodeTree::CodeOp_*>_*,_std::default_delete<Lib::Stack<Indexing::CodeTree::CodeOp_*>_>_>
  .super__Head_base<0UL,_Lib::Stack<Indexing::CodeTree::CodeOp_*>_*,_false>._M_head_impl =
       local_90._self._M_t.
       super___uniq_ptr_impl<Lib::Stack<Indexing::CodeTree::CodeOp_*>,_std::default_delete<Lib::Stack<Indexing::CodeTree::CodeOp_*>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_Lib::Stack<Indexing::CodeTree::CodeOp_*>_*,_std::default_delete<Lib::Stack<Indexing::CodeTree::CodeOp_*>_>_>
       .super__Head_base<0UL,_Lib::Stack<Indexing::CodeTree::CodeOp_*>_*,_false>._M_head_impl;
  if ((uVar11 & 0xfffff) == 0) {
    pCVar4 = (this->super_CodeTree)._entryPoint;
    if (*(CodeOp ***)
         ((long)local_90._self._M_t.
                super___uniq_ptr_impl<Lib::Stack<Indexing::CodeTree::CodeOp_*>,_std::default_delete<Lib::Stack<Indexing::CodeTree::CodeOp_*>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_Lib::Stack<Indexing::CodeTree::CodeOp_*>_*,_std::default_delete<Lib::Stack<Indexing::CodeTree::CodeOp_*>_>_>
                .super__Head_base<0UL,_Lib::Stack<Indexing::CodeTree::CodeOp_*>_*,_false>.
                _M_head_impl + 0x10) ==
        *(CodeOp ***)
         ((long)local_90._self._M_t.
                super___uniq_ptr_impl<Lib::Stack<Indexing::CodeTree::CodeOp_*>,_std::default_delete<Lib::Stack<Indexing::CodeTree::CodeOp_*>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_Lib::Stack<Indexing::CodeTree::CodeOp_*>_*,_std::default_delete<Lib::Stack<Indexing::CodeTree::CodeOp_*>_>_>
                .super__Head_base<0UL,_Lib::Stack<Indexing::CodeTree::CodeOp_*>_*,_false>.
                _M_head_impl + 0x18)) {
      ::Lib::Stack<Indexing::CodeTree::CodeOp_*>::expand
                ((Stack<Indexing::CodeTree::CodeOp_*> *)
                 local_90._self._M_t.
                 super___uniq_ptr_impl<Lib::Stack<Indexing::CodeTree::CodeOp_*>,_std::default_delete<Lib::Stack<Indexing::CodeTree::CodeOp_*>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Lib::Stack<Indexing::CodeTree::CodeOp_*>_*,_std::default_delete<Lib::Stack<Indexing::CodeTree::CodeOp_*>_>_>
                 .super__Head_base<0UL,_Lib::Stack<Indexing::CodeTree::CodeOp_*>_*,_false>.
                 _M_head_impl);
    }
    pCVar15 = (CodeOp *)(pCVar4 + 8);
    **(CodeOp ***)
      ((long)SVar7._M_t.
             super___uniq_ptr_impl<Lib::Stack<Indexing::CodeTree::CodeOp_*>,_std::default_delete<Lib::Stack<Indexing::CodeTree::CodeOp_*>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_Lib::Stack<Indexing::CodeTree::CodeOp_*>_*,_std::default_delete<Lib::Stack<Indexing::CodeTree::CodeOp_*>_>_>
             .super__Head_base<0UL,_Lib::Stack<Indexing::CodeTree::CodeOp_*>_*,_false>._M_head_impl
      + 0x10) = pCVar15;
    pppCVar1 = (CodeOp ***)
               ((long)SVar7._M_t.
                      super___uniq_ptr_impl<Lib::Stack<Indexing::CodeTree::CodeOp_*>,_std::default_delete<Lib::Stack<Indexing::CodeTree::CodeOp_*>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Lib::Stack<Indexing::CodeTree::CodeOp_*>_*,_std::default_delete<Lib::Stack<Indexing::CodeTree::CodeOp_*>_>_>
                      .super__Head_base<0UL,_Lib::Stack<Indexing::CodeTree::CodeOp_*>_*,_false>.
                      _M_head_impl + 0x10);
    *pppCVar1 = *pppCVar1 + 1;
    removeOneOfAlternatives
              (this,pCVar15,(Clause *)__filename,
               (Stack<Indexing::CodeTree::CodeOp_*> *)
               local_90._self._M_t.
               super___uniq_ptr_impl<Lib::Stack<Indexing::CodeTree::CodeOp_*>,_std::default_delete<Lib::Stack<Indexing::CodeTree::CodeOp_*>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_Lib::Stack<Indexing::CodeTree::CodeOp_*>_*,_std::default_delete<Lib::Stack<Indexing::CodeTree::CodeOp_*>_>_>
               .super__Head_base<0UL,_Lib::Stack<Indexing::CodeTree::CodeOp_*>_*,_false>.
               _M_head_impl);
  }
  else {
    lVar14 = 0;
    litIndex = 0;
    local_80 = s;
    do {
      CodeTree::LitInfo::LitInfo(&local_78,(Clause *)__filename,litIndex);
      pLVar6 = remove::lInfos._array;
      (&(remove::lInfos._array)->opposite)[lVar14] = local_78.opposite;
      puVar3 = (undefined8 *)((long)&pLVar6->liIndex + lVar14);
      *puVar3 = local_78._0_8_;
      puVar3[1] = local_78.ft;
      *(uint *)((long)&(remove::lInfos._array)->liIndex + lVar14) = litIndex;
      litIndex = litIndex + 1;
      lVar14 = lVar14 + 0x18;
    } while ((ulong)((uVar16 & 0xfffff) << 3) * 3 != lVar14);
    CodeTree::incTimeStamp(&this->super_CodeTree);
    uVar11 = local_80;
    SVar7._M_t.
    super___uniq_ptr_impl<Lib::Stack<Indexing::CodeTree::CodeOp_*>,_std::default_delete<Lib::Stack<Indexing::CodeTree::CodeOp_*>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_Lib::Stack<Indexing::CodeTree::CodeOp_*>_*,_std::default_delete<Lib::Stack<Indexing::CodeTree::CodeOp_*>_>_>
    .super__Head_base<0UL,_Lib::Stack<Indexing::CodeTree::CodeOp_*>_*,_false>._M_head_impl =
         local_90._self._M_t.
         super___uniq_ptr_impl<Lib::Stack<Indexing::CodeTree::CodeOp_*>,_std::default_delete<Lib::Stack<Indexing::CodeTree::CodeOp_*>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_Lib::Stack<Indexing::CodeTree::CodeOp_*>_*,_std::default_delete<Lib::Stack<Indexing::CodeTree::CodeOp_*>_>_>
         .super__Head_base<0UL,_Lib::Stack<Indexing::CodeTree::CodeOp_*>_*,_false>._M_head_impl;
    pCVar4 = (this->super_CodeTree)._entryPoint;
    if (*(CodeOp ***)
         ((long)local_90._self._M_t.
                super___uniq_ptr_impl<Lib::Stack<Indexing::CodeTree::CodeOp_*>,_std::default_delete<Lib::Stack<Indexing::CodeTree::CodeOp_*>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_Lib::Stack<Indexing::CodeTree::CodeOp_*>_*,_std::default_delete<Lib::Stack<Indexing::CodeTree::CodeOp_*>_>_>
                .super__Head_base<0UL,_Lib::Stack<Indexing::CodeTree::CodeOp_*>_*,_false>.
                _M_head_impl + 0x10) ==
        *(CodeOp ***)
         ((long)local_90._self._M_t.
                super___uniq_ptr_impl<Lib::Stack<Indexing::CodeTree::CodeOp_*>,_std::default_delete<Lib::Stack<Indexing::CodeTree::CodeOp_*>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_Lib::Stack<Indexing::CodeTree::CodeOp_*>_*,_std::default_delete<Lib::Stack<Indexing::CodeTree::CodeOp_*>_>_>
                .super__Head_base<0UL,_Lib::Stack<Indexing::CodeTree::CodeOp_*>_*,_false>.
                _M_head_impl + 0x18)) {
      ::Lib::Stack<Indexing::CodeTree::CodeOp_*>::expand
                ((Stack<Indexing::CodeTree::CodeOp_*> *)
                 local_90._self._M_t.
                 super___uniq_ptr_impl<Lib::Stack<Indexing::CodeTree::CodeOp_*>,_std::default_delete<Lib::Stack<Indexing::CodeTree::CodeOp_*>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Lib::Stack<Indexing::CodeTree::CodeOp_*>_*,_std::default_delete<Lib::Stack<Indexing::CodeTree::CodeOp_*>_>_>
                 .super__Head_base<0UL,_Lib::Stack<Indexing::CodeTree::CodeOp_*>_*,_false>.
                 _M_head_impl);
    }
    pCVar15 = (CodeOp *)(pCVar4 + 8);
    **(CodeOp ***)
      ((long)SVar7._M_t.
             super___uniq_ptr_impl<Lib::Stack<Indexing::CodeTree::CodeOp_*>,_std::default_delete<Lib::Stack<Indexing::CodeTree::CodeOp_*>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_Lib::Stack<Indexing::CodeTree::CodeOp_*>_*,_std::default_delete<Lib::Stack<Indexing::CodeTree::CodeOp_*>_>_>
             .super__Head_base<0UL,_Lib::Stack<Indexing::CodeTree::CodeOp_*>_*,_false>._M_head_impl
      + 0x10) = pCVar15;
    pppCVar1 = (CodeOp ***)
               ((long)SVar7._M_t.
                      super___uniq_ptr_impl<Lib::Stack<Indexing::CodeTree::CodeOp_*>,_std::default_delete<Lib::Stack<Indexing::CodeTree::CodeOp_*>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Lib::Stack<Indexing::CodeTree::CodeOp_*>_*,_std::default_delete<Lib::Stack<Indexing::CodeTree::CodeOp_*>_>_>
                      .super__Head_base<0UL,_Lib::Stack<Indexing::CodeTree::CodeOp_*>_*,_false>.
                      _M_head_impl + 0x10);
    *pppCVar1 = *pppCVar1 + 1;
    iVar12 = (int)uVar11 + -1;
    iVar13 = 0;
    do {
      ::Lib::
      Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
      ::Recycled((Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
                  *)&local_78);
      this_00._M_head_impl = (RemovingLiteralMatcher *)local_78._0_8_;
      CodeTree::RemovingMatcher<false>::init
                ((RemovingMatcher<false> *)local_78._0_8_,(EVP_PKEY_CTX *)pCVar15);
      CodeTree::RemovingMatcher<false>::prepareLiteral
                (&(this_00._M_head_impl)->super_RemovingMatcher<false>);
      SVar8._M_t.
      super___uniq_ptr_impl<Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>,_std::default_delete<Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>_*,_std::default_delete<Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>_>_>
      .
      super__Head_base<0UL,_Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>,_std::default_delete<Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>_>,_true,_true>
            )(__uniq_ptr_data<Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>,_std::default_delete<Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>_>,_true,_true>
              )local_60._self;
      local_50._self._M_t.
      super___uniq_ptr_impl<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>
      ._M_t.
      super__Tuple_impl<0UL,_Indexing::ClauseCodeTree::RemovingLiteralMatcher_*,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>
      .super__Head_base<0UL,_Indexing::ClauseCodeTree::RemovingLiteralMatcher_*,_false>._M_head_impl
           = (__uniq_ptr_data<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>,_true,_true>
              )(__uniq_ptr_data<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>,_true,_true>
                )local_78._0_8_;
      local_78._0_8_ = (RemovingMatcher<false> *)0x0;
      if (*(Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
            **)((long)local_60._self._M_t.
                      super___uniq_ptr_impl<Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>,_std::default_delete<Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>_*,_std::default_delete<Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>_>_>
                      .
                      super__Head_base<0UL,_Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>_*,_false>
                      ._M_head_impl + 0x10) ==
          *(Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
            **)((long)local_60._self._M_t.
                      super___uniq_ptr_impl<Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>,_std::default_delete<Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>_*,_std::default_delete<Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>_>_>
                      .
                      super__Head_base<0UL,_Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>_*,_false>
                      ._M_head_impl + 0x18)) {
        ::Lib::
        Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>
        ::expand((Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>
                  *)local_60._self._M_t.
                    super___uniq_ptr_impl<Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>,_std::default_delete<Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>_*,_std::default_delete<Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>_>_>
                    .
                    super__Head_base<0UL,_Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>_*,_false>
                    ._M_head_impl);
      }
      ((*(Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
          **)((long)SVar8._M_t.
                    super___uniq_ptr_impl<Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>,_std::default_delete<Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>_*,_std::default_delete<Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>_>_>
                    .
                    super__Head_base<0UL,_Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>_*,_false>
                    ._M_head_impl + 0x10))->_self)._M_t.
      super___uniq_ptr_impl<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>
      ._M_t.
      super__Tuple_impl<0UL,_Indexing::ClauseCodeTree::RemovingLiteralMatcher_*,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>
      .super__Head_base<0UL,_Indexing::ClauseCodeTree::RemovingLiteralMatcher_*,_false>._M_head_impl
           = (RemovingLiteralMatcher *)
             local_50._self._M_t.
             super___uniq_ptr_impl<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>
             ._M_t.
             super__Tuple_impl<0UL,_Indexing::ClauseCodeTree::RemovingLiteralMatcher_*,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>
             .super__Head_base<0UL,_Indexing::ClauseCodeTree::RemovingLiteralMatcher_*,_false>.
             _M_head_impl;
      local_50._self._M_t.
      super___uniq_ptr_impl<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>
      ._M_t.
      super__Tuple_impl<0UL,_Indexing::ClauseCodeTree::RemovingLiteralMatcher_*,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>
      .super__Head_base<0UL,_Indexing::ClauseCodeTree::RemovingLiteralMatcher_*,_false>._M_head_impl
           = (__uniq_ptr_data<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>,_true,_true>
              )(__uniq_ptr_impl<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>
                )0x0;
      ppRVar2 = (Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
                 **)((long)SVar8._M_t.
                           super___uniq_ptr_impl<Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>,_std::default_delete<Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>_*,_std::default_delete<Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>_>_>
                           .
                           super__Head_base<0UL,_Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>_*,_false>
                           ._M_head_impl + 0x10);
      *ppRVar2 = *ppRVar2 + 1;
      ::Lib::
      Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
      ::~Recycled(&local_50);
      ::Lib::
      Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
      ::~Recycled((Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
                   *)&local_78);
      do {
        do {
          while (bVar9 = CodeTree::RemovingMatcher<false>::next
                                   (&(this_00._M_head_impl)->super_RemovingMatcher<false>), !bVar9)
          {
            pRVar5 = *(Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
                       **)((long)local_60._self._M_t.
                                 super___uniq_ptr_impl<Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>,_std::default_delete<Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>_*,_std::default_delete<Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>_>_>
                                 .
                                 super__Head_base<0UL,_Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>_*,_false>
                                 ._M_head_impl + 0x10);
            *(Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
              **)((long)local_60._self._M_t.
                        super___uniq_ptr_impl<Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>,_std::default_delete<Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>_*,_std::default_delete<Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>_>_>
                        .
                        super__Head_base<0UL,_Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>_*,_false>
                        ._M_head_impl + 0x10) = pRVar5 + -1;
            local_40._self._M_t.
            super___uniq_ptr_impl<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>
            ._M_t.
            super__Tuple_impl<0UL,_Indexing::ClauseCodeTree::RemovingLiteralMatcher_*,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>
            .super__Head_base<0UL,_Indexing::ClauseCodeTree::RemovingLiteralMatcher_*,_false>.
            _M_head_impl = (__uniq_ptr_data<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>,_true,_true>
                            )pRVar5[-1]._self._M_t.
                             super___uniq_ptr_impl<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_Indexing::ClauseCodeTree::RemovingLiteralMatcher_*,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>
                             .
                             super__Head_base<0UL,_Indexing::ClauseCodeTree::RemovingLiteralMatcher_*,_false>
                             ._M_head_impl;
            pRVar5[-1]._self._M_t.
            super___uniq_ptr_impl<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>
            ._M_t.
            super__Tuple_impl<0UL,_Indexing::ClauseCodeTree::RemovingLiteralMatcher_*,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>
            .super__Head_base<0UL,_Indexing::ClauseCodeTree::RemovingLiteralMatcher_*,_false>.
            _M_head_impl = (RemovingLiteralMatcher *)0x0;
            ::Lib::
            Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
            ::~Recycled(*(Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
                          **)((long)local_60._self._M_t.
                                    super___uniq_ptr_impl<Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>,_std::default_delete<Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>_*,_std::default_delete<Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>_>_>
                                    .
                                    super__Head_base<0UL,_Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>_*,_false>
                                    ._M_head_impl + 0x10));
            ::Lib::
            Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
            ::~Recycled(&local_40);
            iVar13 = iVar13 + -1;
            this_00._M_head_impl =
                 (*(Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
                    **)((long)local_60._self._M_t.
                              super___uniq_ptr_impl<Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>,_std::default_delete<Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>_*,_std::default_delete<Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>_>_>
                              .
                              super__Head_base<0UL,_Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>_*,_false>
                              ._M_head_impl + 0x10))[-1]._self._M_t.
                 super___uniq_ptr_impl<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Indexing::ClauseCodeTree::RemovingLiteralMatcher_*,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>
                 .super__Head_base<0UL,_Indexing::ClauseCodeTree::RemovingLiteralMatcher_*,_false>.
                 _M_head_impl;
          }
          pCVar15 = ((this_00._M_head_impl)->super_RemovingMatcher<false>).super_BaseMatcher.op;
          uVar11 = pCVar15->_content >> 3;
          uVar16 = (this->super_CodeTree)._curTimeStamp;
        } while (*(uint *)(uVar11 + 0x30) == uVar16);
        pCVar15 = pCVar15 + 1;
        *(uint *)(uVar11 + 0x30) = uVar16;
        if (iVar13 != iVar12) {
          iVar10 = iVar13 + 1;
          break;
        }
        bVar9 = removeOneOfAlternatives
                          (this,pCVar15,(Clause *)__filename,
                           (Stack<Indexing::CodeTree::CodeOp_*> *)
                           local_90._self._M_t.
                           super___uniq_ptr_impl<Lib::Stack<Indexing::CodeTree::CodeOp_*>,_std::default_delete<Lib::Stack<Indexing::CodeTree::CodeOp_*>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_Lib::Stack<Indexing::CodeTree::CodeOp_*>_*,_std::default_delete<Lib::Stack<Indexing::CodeTree::CodeOp_*>_>_>
                           .super__Head_base<0UL,_Lib::Stack<Indexing::CodeTree::CodeOp_*>_*,_false>
                           ._M_head_impl);
        iVar10 = iVar13;
      } while (!bVar9);
      bVar9 = iVar13 != iVar12;
      iVar13 = iVar10;
    } while (bVar9);
    iVar13 = (int)local_80;
    lVar14 = 0;
    do {
      CodeTree::LitInfo::dispose((LitInfo *)((long)&(remove::lInfos._array)->liIndex + lVar14));
      lVar14 = lVar14 + 0x18;
    } while ((ulong)(iVar13 + (uint)(iVar13 == 0)) * 0x18 != lVar14);
  }
  ::Lib::
  Recycled<Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::~Recycled(&local_60);
  ::Lib::
  Recycled<Lib::Stack<Indexing::CodeTree::CodeOp_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
  ~Recycled(&local_90);
  return extraout_EAX;
}

Assistant:

void ClauseCodeTree::remove(Clause* cl)
{
  static DArray<LitInfo> lInfos;
  Recycled<Stack<CodeOp*>> firstsInBlocks;
  Recycled<Stack<Recycled<RemovingLiteralMatcher, NoReset>>> rlms;

  unsigned clen=cl->length();
  lInfos.ensure(clen);

  if(!clen) {
    CodeOp* op=getEntryPoint();
    firstsInBlocks->push(op);
    if(!removeOneOfAlternatives(op, cl, &*firstsInBlocks)) {
      ASSERTION_VIOLATION;
      INVALID_OPERATION("empty clause to be removed was not found");
    }
    return;
  }

  for(unsigned i=0;i<clen;i++) {
    lInfos[i]=LitInfo(cl,i);
    lInfos[i].liIndex=i;
  }
  incTimeStamp();

  CodeOp* op=getEntryPoint();
  firstsInBlocks->push(op);
  unsigned depth=0;
  for(;;) {
    RemovingLiteralMatcher* rlm = 0;
    {
      Recycled<RemovingLiteralMatcher, NoReset> rrlm; // take rlm out of recycling
      rlm = &*rrlm; // get the actual content (also to use after this initialization block)
      rlm->init(op, lInfos.array(), lInfos.size(), this, &*firstsInBlocks); // init it
      rlms->push(std::move(rrlm)); // store it in rlms (along with the obligation to return to recycling when no longer used)
    }

  iteration_restart:
    if(!rlm->next()) {
      if(depth==0) {
        ASSERTION_VIOLATION;
        INVALID_OPERATION("clause to be removed was not found");
      }
      rlms->pop();
      depth--;
      rlm = &*rlms->top();
      goto iteration_restart;
    }

    op=rlm->op;
    ASS(op->isLitEnd());
    ASS_EQ(op->getILS()->depth, depth);

    if(op->getILS()->timestamp==_curTimeStamp) {
      //we have already been here
      goto iteration_restart;
    }
    op->getILS()->timestamp=_curTimeStamp;

    op++;
    if(depth==clen-1) {
      if(removeOneOfAlternatives(op, cl, &*firstsInBlocks)) {
        //successfully removed
        break;
      }
      goto iteration_restart;
    }
    ASS_L(depth,clen-1);
    depth++;
  }

  for(unsigned i=0;i<clen;i++) {
    lInfos[i].dispose();
  }
}